

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dotdot.c
# Opt level: O2

char * Curl_dedotdotify(char *input)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *__s;
  char *pcVar7;
  byte *__dest;
  byte *pbVar8;
  int iVar9;
  byte *pbVar10;
  byte *pbVar11;
  char cVar12;
  uint uVar13;
  
  sVar5 = strlen(input);
  pbVar6 = (byte *)(*Curl_cmalloc)(sVar5 + 1);
  if (pbVar6 == (byte *)0x0) {
    pbVar11 = (byte *)0x0;
  }
  else {
    *pbVar6 = 0;
    __s = (byte *)(*Curl_cstrdup)(input);
    pbVar10 = pbVar6;
    if (__s == (byte *)0x0) {
      pbVar11 = (byte *)0x0;
    }
    else {
      bVar2 = *__s;
      pbVar11 = __s;
      if (bVar2 != 0) {
        pcVar7 = strchr((char *)__s,0x3f);
        __dest = pbVar6;
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '\0';
          bVar2 = *__s;
        }
        do {
          uVar13 = (uint)bVar2;
          pbVar10 = pbVar11 + 2;
          while( true ) {
            cVar12 = (char)uVar13;
            iVar9 = 0x2e - uVar13;
            iVar3 = iVar9;
            pbVar11 = pbVar10;
            if (cVar12 == '.') {
              if (pbVar10[-1] == 0x2f) goto LAB_0013cc85;
              if (pbVar10[-1] - 0x2e == 0) {
                iVar3 = 0x2f - (uint)*pbVar10;
              }
              else {
                iVar3 = -(pbVar10[-1] - 0x2e);
              }
            }
            if (iVar3 == 0) {
              pbVar11 = pbVar10 + 1;
              goto LAB_0013cc85;
            }
            iVar3 = 0x2f - uVar13;
            if (cVar12 == '/') {
              if (pbVar10[-1] - 0x2e == 0) {
                iVar3 = 0x2f - (uint)*pbVar10;
              }
              else {
                iVar3 = -(pbVar10[-1] - 0x2e);
              }
              if (iVar3 == 0) goto LAB_0013cc85;
              uVar4 = pbVar10[-1] - 0x2e;
              if (uVar4 == 0) {
                uVar4 = (uint)*pbVar10;
              }
              iVar3 = -uVar4;
            }
            if (iVar3 != 0) break;
            pbVar10[-1] = 0x2f;
            pbVar10 = pbVar10 + 1;
            uVar13 = 0x2f;
          }
          pbVar11 = pbVar10 + -2;
          iVar3 = strncmp("/../",(char *)pbVar11,4);
          if (iVar3 == 0) {
            do {
              pbVar11 = pbVar10 + 1;
              if (__dest <= pbVar6) break;
              pbVar8 = __dest + -1;
              pbVar1 = __dest + -1;
              __dest = pbVar8;
            } while (*pbVar1 != 0x2f);
LAB_0013cc70:
            *__dest = 0;
          }
          else {
            iVar3 = strcmp("/..",(char *)pbVar11);
            if (iVar3 == 0) {
              *pbVar10 = 0x2f;
              pbVar8 = __dest;
              do {
                __dest = pbVar8;
                pbVar11 = pbVar10;
                if (pbVar8 <= pbVar6) break;
                __dest = pbVar8 + -1;
                pbVar1 = pbVar8 + -1;
                pbVar8 = __dest;
              } while (*pbVar1 != 0x2f);
              goto LAB_0013cc70;
            }
            if (cVar12 == '.') {
              if (pbVar10[-1] != 0) {
                uVar4 = pbVar10[-1] - 0x2e;
                if (uVar4 == 0) {
                  uVar4 = (uint)*pbVar10;
                }
                iVar9 = -uVar4;
                goto LAB_0013cc0a;
              }
LAB_0013cc78:
              *pbVar11 = 0;
              *pbVar6 = 0;
            }
            else {
LAB_0013cc0a:
              if (iVar9 == 0) goto LAB_0013cc78;
              do {
                *__dest = (byte)uVar13;
                __dest = __dest + 1;
                bVar2 = pbVar11[1];
                uVar13 = (uint)bVar2;
                pbVar11 = pbVar11 + 1;
                if (bVar2 == 0x2f) break;
              } while (bVar2 != 0);
              *__dest = 0;
            }
          }
LAB_0013cc85:
          bVar2 = *pbVar11;
        } while (bVar2 != 0);
        pbVar10 = __s;
        pbVar11 = pbVar6;
        if (pcVar7 != (char *)0x0) {
          sVar5 = strlen(input + ((long)pcVar7 - (long)__s));
          memcpy(__dest,input + ((long)pcVar7 - (long)__s),sVar5 + 1);
        }
      }
    }
    (*Curl_cfree)(pbVar10);
  }
  return (char *)pbVar11;
}

Assistant:

char *Curl_dedotdotify(const char *input)
{
  size_t inlen = strlen(input);
  char *clone;
  size_t clen = inlen; /* the length of the cloned input */
  char *out = malloc(inlen + 1);
  char *outptr;
  char *orgclone;
  char *queryp;
  if(!out)
    return NULL; /* out of memory */

  *out = 0; /* zero terminates, for inputs like "./" */

  /* get a cloned copy of the input */
  clone = strdup(input);
  if(!clone) {
    free(out);
    return NULL;
  }
  orgclone = clone;
  outptr = out;

  if(!*clone) {
    /* zero length string, return that */
    free(out);
    return clone;
  }

  /*
   * To handle query-parts properly, we must find it and remove it during the
   * dotdot-operation and then append it again at the end to the output
   * string.
   */
  queryp = strchr(clone, '?');
  if(queryp)
    *queryp = 0;

  do {

    /*  A.  If the input buffer begins with a prefix of "../" or "./", then
        remove that prefix from the input buffer; otherwise, */

    if(!strncmp("./", clone, 2)) {
      clone += 2;
      clen -= 2;
    }
    else if(!strncmp("../", clone, 3)) {
      clone += 3;
      clen -= 3;
    }

    /*  B.  if the input buffer begins with a prefix of "/./" or "/.", where
        "."  is a complete path segment, then replace that prefix with "/" in
        the input buffer; otherwise, */
    else if(!strncmp("/./", clone, 3)) {
      clone += 2;
      clen -= 2;
    }
    else if(!strcmp("/.", clone)) {
      clone[1]='/';
      clone++;
      clen -= 1;
    }

    /*  C.  if the input buffer begins with a prefix of "/../" or "/..", where
        ".." is a complete path segment, then replace that prefix with "/" in
        the input buffer and remove the last segment and its preceding "/" (if
        any) from the output buffer; otherwise, */

    else if(!strncmp("/../", clone, 4)) {
      clone += 3;
      clen -= 3;
      /* remove the last segment from the output buffer */
      while(outptr > out) {
        outptr--;
        if(*outptr == '/')
          break;
      }
      *outptr = 0; /* zero-terminate where it stops */
    }
    else if(!strcmp("/..", clone)) {
      clone[2]='/';
      clone += 2;
      clen -= 2;
      /* remove the last segment from the output buffer */
      while(outptr > out) {
        outptr--;
        if(*outptr == '/')
          break;
      }
      *outptr = 0; /* zero-terminate where it stops */
    }

    /*  D.  if the input buffer consists only of "." or "..", then remove
        that from the input buffer; otherwise, */

    else if(!strcmp(".", clone) || !strcmp("..", clone)) {
      *clone = 0;
      *out = 0;
    }

    else {
      /*  E.  move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *clone++;
        clen--;
      } while(*clone && (*clone != '/'));
      *outptr = 0;
    }

  } while(*clone);

  if(queryp) {
    size_t qlen;
    /* There was a query part, append that to the output. The 'clone' string
       may now have been altered so we copy from the original input string
       from the correct index. */
    size_t oindex = queryp - orgclone;
    qlen = strlen(&input[oindex]);
    memcpy(outptr, &input[oindex], qlen + 1); /* include the end zero byte */
  }

  free(orgclone);
  return out;
}